

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfdriver.c
# Opt level: O1

char * sfnt_get_ps_name(TT_Face face)

{
  char cVar1;
  FT_UInt FVar2;
  FT_Memory pFVar3;
  TT_NameRec *pTVar4;
  FT_Stream pFVar5;
  void *pvVar6;
  FT_Bool FVar7;
  uint uVar8;
  char *__s;
  size_t sVar9;
  char *pcVar10;
  uint *puVar11;
  long lVar12;
  byte bVar13;
  uint uVar14;
  int iVar15;
  uint uVar16;
  int iVar17;
  byte *pbVar18;
  long lVar19;
  long lVar20;
  int *piVar21;
  uint uVar22;
  uint uVar23;
  ulong uVar24;
  byte *pbVar25;
  char *pcVar26;
  byte bVar27;
  uint uVar28;
  uint uVar29;
  bool bVar30;
  FT_Int apple_1;
  FT_Int win_1;
  FT_UInt num_coords;
  FT_Int apple;
  char *subfamily_name;
  FT_MM_Var *mm_var;
  FT_Error error;
  FT_Int win;
  int local_74;
  int local_70;
  uint local_6c;
  uint *local_68;
  char *local_60;
  long local_58;
  int local_4c;
  undefined8 local_48;
  int local_40;
  uint local_3c [3];
  
  if (face->postscript_name != (char *)0x0) {
    return face->postscript_name;
  }
  if ((face->blend == (GX_Blend)0x0) ||
     ((((face->root).face_index & 0x7fff0000) == 0 && (((face->root).face_flags & 0x8000) == 0)))) {
    FVar7 = sfnt_get_name_id(face,6,(FT_Int *)&local_48,(FT_Int *)&local_68);
    if (FVar7 == '\0') {
      return (char *)0x0;
    }
    pFVar3 = (face->root).memory;
    pTVar4 = (face->name_table).names;
    pFVar5 = (face->name_table).stream;
    if ((long)(int)local_48 == -1) {
      __s = get_apple_string(pFVar3,pFVar5,pTVar4 + (int)local_68,sfnt_is_postscript,'\x01');
    }
    else {
      __s = get_win_string(pFVar3,pFVar5,pTVar4 + (int)local_48,sfnt_is_postscript,'\x01');
    }
    goto LAB_00164a9c;
  }
  pFVar3 = (face->root).memory;
  pvVar6 = face->mm;
  if (face->var_postscript_prefix == (char *)0x0) {
    FVar7 = sfnt_get_name_id(face,0x19,&local_70,&local_74);
    if ((FVar7 == '\0') && (FVar7 = sfnt_get_name_id(face,0x10,&local_70,&local_74), FVar7 == '\0'))
    {
      FVar7 = sfnt_get_name_id(face,1,&local_70,&local_74);
      bVar30 = FVar7 == '\0';
    }
    else {
      bVar30 = false;
    }
    if (bVar30) {
      __s = (char *)0x0;
    }
    else {
      pTVar4 = (face->name_table).names;
      pFVar5 = (face->name_table).stream;
      if ((long)local_70 == -1) {
        __s = get_apple_string(pFVar3,pFVar5,pTVar4 + local_74,sfnt_is_alphanumeric,'\0');
      }
      else {
        __s = get_win_string(pFVar3,pFVar5,pTVar4 + local_70,sfnt_is_alphanumeric,'\0');
      }
      sVar9 = strlen(__s);
      uVar8 = (uint)sVar9;
      if (0x5b < uVar8) {
        __s[0x5b] = '\0';
        uVar8 = 0x5b;
      }
      face->var_postscript_prefix = __s;
      face->var_postscript_prefix_len = uVar8;
    }
    if (!bVar30) goto LAB_00164224;
LAB_0016442f:
    __s = (char *)0x0;
  }
  else {
    __s = (char *)0x0;
LAB_00164224:
    (**(code **)((long)pvVar6 + 0x40))(face,&local_6c,&local_68,0,&local_58);
    uVar24 = (face->root).face_index & 0x7fff0000;
    if ((uVar24 == 0) || (((face->root).face_flags & 0x8000) != 0)) {
LAB_001643f9:
      lVar12 = *(long *)(local_58 + 0x10);
      __s = (char *)ft_mem_alloc(pFVar3,(ulong)(face->var_postscript_prefix_len + local_6c * 0x11 +
                                               1),&local_4c);
      if (local_4c != 0) goto LAB_0016442f;
      strcpy(__s,face->var_postscript_prefix);
      pbVar25 = (byte *)(__s + face->var_postscript_prefix_len);
      if (local_6c != 0) {
        uVar8 = 0;
        pbVar18 = pbVar25;
        do {
          pbVar25 = pbVar18;
          if (*(long *)local_68 != *(long *)(lVar12 + 0x10)) {
            pbVar25 = pbVar18 + 1;
            *pbVar18 = 0x5f;
            uVar14 = *local_68;
            if (uVar14 == 0) {
              pbVar18[1] = 0x30;
              pbVar25 = pbVar18 + 2;
            }
            else {
              if ((int)uVar14 < 0) {
                pbVar18[1] = 0x2d;
                pbVar25 = pbVar18 + 2;
                uVar14 = -uVar14;
              }
              pbVar18 = (byte *)&local_48;
              if (0xffff < uVar14) {
                uVar24 = (ulong)(uVar14 >> 0x10);
                do {
                  uVar22 = (uint)uVar24;
                  *pbVar18 = (char)uVar24 + (char)(uVar24 / 10) * -10 | 0x30;
                  pbVar18 = pbVar18 + 1;
                  uVar24 = uVar24 / 10;
                } while (9 < uVar22);
              }
              for (; &local_48 < pbVar18; pbVar18 = pbVar18 + -1) {
                *pbVar25 = pbVar18[-1];
                pbVar25 = pbVar25 + 1;
              }
              if ((uVar14 & 0xffff) != 0) {
                *pbVar25 = 0x2e;
                lVar19 = 0;
                uVar14 = (uVar14 & 0xffff) * 10 + 5;
                do {
                  uVar22 = uVar14;
                  lVar20 = lVar19;
                  cVar1 = (char)(uVar22 >> 0x10);
                  bVar27 = cVar1 + 0x30;
                  pbVar25[lVar20 + 1] = bVar27;
                  if ((uVar22 & 0xffff) == 0) {
                    uVar14 = 0;
                    break;
                  }
                  uVar14 = (uVar22 & 0xffff) * 10;
                  lVar19 = lVar20 + 1;
                } while ((int)(lVar20 + 1) != 5);
                pbVar25 = pbVar25 + lVar20 + 1;
                if (lVar20 == 4) {
                  bVar13 = 0x30;
                  if (0x542df < uVar14 || bVar27 != 0x31) {
                    if (((uVar22 >> 0x10 & 1) == 0 || uVar14 != 0x2a120) &&
                       (uVar22 < 0x10000 || 0x2a11f < uVar14)) goto LAB_001645c1;
                    bVar13 = cVar1 + 0x2f;
                  }
                  *pbVar25 = bVar13;
                }
LAB_001645c1:
                bVar27 = *pbVar25;
                while (bVar27 == 0x30) {
                  *pbVar25 = 0;
                  bVar27 = pbVar25[-1];
                  pbVar25 = pbVar25 + -1;
                }
                pbVar25 = pbVar25 + 1;
              }
            }
            bVar27 = *(byte *)(lVar12 + 0x23);
            if ((bVar27 != 0x20) &&
               (iVar15 = (int)(char)bVar27,
               iVar15 - 0x61U < 0x1a || (iVar15 - 0x41U < 0x1a || iVar15 - 0x30U < 10))) {
              *pbVar25 = bVar27;
              pbVar25 = pbVar25 + 1;
            }
            bVar27 = *(byte *)(lVar12 + 0x22);
            if ((bVar27 != 0x20) &&
               (iVar15 = (int)(char)bVar27,
               iVar15 - 0x61U < 0x1a || (iVar15 - 0x41U < 0x1a || iVar15 - 0x30U < 10))) {
              *pbVar25 = bVar27;
              pbVar25 = pbVar25 + 1;
            }
            bVar27 = *(byte *)(lVar12 + 0x21);
            if ((bVar27 != 0x20) &&
               (iVar15 = (int)(char)bVar27,
               iVar15 - 0x61U < 0x1a || (iVar15 - 0x41U < 0x1a || iVar15 - 0x30U < 10))) {
              *pbVar25 = bVar27;
              pbVar25 = pbVar25 + 1;
            }
            bVar27 = *(byte *)(lVar12 + 0x20);
            if ((bVar27 != 0x20) &&
               (iVar15 = (int)(char)bVar27,
               iVar15 - 0x61U < 0x1a || (iVar15 - 0x41U < 0x1a || iVar15 - 0x30U < 10))) {
              *pbVar25 = bVar27;
              pbVar25 = pbVar25 + 1;
            }
          }
          local_68 = local_68 + 2;
          uVar8 = uVar8 + 1;
          lVar12 = lVar12 + 0x30;
          pbVar18 = pbVar25;
        } while (uVar8 < local_6c);
      }
    }
    else {
      pvVar6 = face->sfnt;
      pbVar25 = (byte *)(((uVar24 >> 0x10) - 1) * 0x10);
      uVar8 = *(uint *)(pbVar25 + *(long *)(local_58 + 0x18) + 0xc);
      local_48 = (char *)0x0;
      if (uVar8 == 6 || uVar8 - 0x100 < 0x7f00) {
        (**(code **)((long)pvVar6 + 0xe8))(face,uVar8 & 0xffff,&local_48);
      }
      pcVar26 = local_48;
      if (local_48 == (char *)0x0) {
        (**(code **)((long)pvVar6 + 0xe8))
                  (face,*(undefined2 *)(pbVar25 + *(long *)(local_58 + 0x18) + 8),&local_60);
        if (local_60 == (char *)0x0) {
          iVar15 = 9;
        }
        else {
          FVar2 = face->var_postscript_prefix_len;
          sVar9 = strlen(local_60);
          __s = (char *)ft_mem_alloc(pFVar3,sVar9 + (FVar2 + 1) + 1,&local_4c);
          if (local_4c == 0) {
            strcpy(__s,face->var_postscript_prefix);
            pcVar26 = __s + (ulong)face->var_postscript_prefix_len + 1;
            __s[face->var_postscript_prefix_len] = '-';
            cVar1 = *local_60;
            pcVar10 = local_60;
            while (cVar1 != '\0') {
              pcVar10 = pcVar10 + 1;
              iVar15 = (int)cVar1;
              if (iVar15 - 0x61U < 0x1a || (iVar15 - 0x41U < 0x1a || iVar15 - 0x30U < 10)) {
                *pcVar26 = cVar1;
                pcVar26 = pcVar26 + 1;
              }
              cVar1 = *pcVar10;
            }
            *pcVar26 = '\0';
            pbVar25 = (byte *)(pcVar26 + 1);
            ft_mem_free(pFVar3,local_60);
            local_60 = (char *)0x0;
            iVar15 = 0;
          }
          else {
            iVar15 = 1;
          }
        }
      }
      else {
        sVar9 = strlen(local_48);
        pbVar25 = (byte *)(pcVar26 + sVar9 + 1);
        iVar15 = 6;
        __s = pcVar26;
      }
      if ((iVar15 != 0) && (iVar15 != 6)) {
        if (iVar15 != 9) goto LAB_0016442f;
        goto LAB_001643f9;
      }
    }
    if (0x7f < (long)pbVar25 - (long)__s) {
      uVar8 = (uint)((long)pbVar25 - (long)__s);
      uVar14 = uVar8;
      if ((int)uVar8 < 0) {
        uVar14 = uVar8 + 0xf;
      }
      lVar12 = (long)(int)(uVar14 & 0xfffffff0);
      uVar22 = 0x75bcd15;
      uVar29 = 0x75bcd15;
      uVar28 = 0x75bcd15;
      uVar23 = 0x75bcd15;
      if (0x1e < uVar8 + 0xf) {
        lVar19 = (long)((int)uVar14 >> 4);
        piVar21 = (int *)(__s + lVar12 + lVar19 * -0x10 + 0xc);
        uVar28 = 0x75bcd15;
        uVar29 = 0x75bcd15;
        uVar22 = 0x75bcd15;
        do {
          uVar23 = ((uint)(piVar21[-3] * 0x239b961b) >> 0x11 | piVar21[-3] * -0x34f28000) *
                   -0x54f16877 ^ uVar23;
          iVar15 = (uVar23 << 0x13 | uVar23 >> 0xd) + uVar28;
          uVar23 = iVar15 * 5 + 0x561ccd1b;
          uVar28 = ((uint)(piVar21[-2] * -0x54f16877) >> 0x10 | piVar21[-2] * -0x68770000) *
                   0x38b34ae5 ^ uVar28;
          uVar28 = ((uVar28 << 0x11 | uVar28 >> 0xf) + uVar29) * 5 + 0xbcaa747;
          uVar29 = ((uint)(piVar21[-1] * 0x38b34ae5) >> 0xf | piVar21[-1] * -0x6a360000) *
                   -0x5e1c746d ^ uVar29;
          uVar29 = ((uVar29 << 0xf | uVar29 >> 0x11) + uVar22) * 5 + 0x96cd1c35;
          uVar22 = ((uint)(*piVar21 * -0x5e1c746d) >> 0xe | *piVar21 * 0x2e4c0000) * 0x239b961b ^
                   uVar22;
          uVar22 = ((uVar22 << 0xd | uVar22 >> 0x13) + iVar15 * 5 + 0x561ccd1b) * 5 + 0x32ac3b17;
          piVar21 = piVar21 + 4;
          lVar19 = lVar19 + -1;
        } while (lVar19 != 0);
      }
      uVar16 = 0;
      uVar14 = 0;
      switch(uVar8 & 0xf) {
      case 0xf:
        uVar14 = (uint)(byte)__s[lVar12 + 0xe] << 0x10;
      case 0xe:
        uVar14 = uVar14 | (uint)(byte)__s[lVar12 + 0xd] << 8;
      case 0xd:
        uVar22 = uVar22 ^ (((byte)__s[lVar12 + 0xc] ^ uVar14) * -0x5e1c746d >> 0xe |
                          ((byte)__s[lVar12 + 0xc] ^ uVar14) * 0x2e4c0000) * 0x239b961b;
      case 0xc:
        uVar14 = (uint)(byte)__s[lVar12 + 0xb] << 0x18;
      case 0xb:
        uVar14 = uVar14 | (uint)(byte)__s[lVar12 + 10] << 0x10;
      case 10:
        uVar14 = uVar14 ^ (uint)(byte)__s[lVar12 + 9] << 8;
      case 9:
        uVar29 = uVar29 ^ (((byte)__s[lVar12 + 8] ^ uVar14) * 0x38b34ae5 >> 0xf |
                          ((byte)__s[lVar12 + 8] ^ uVar14) * -0x6a360000) * -0x5e1c746d;
      case 8:
        uVar14 = (uint)(byte)__s[lVar12 + 7] << 0x18;
      case 7:
        uVar14 = uVar14 | (uint)(byte)__s[lVar12 + 6] << 0x10;
      case 6:
        uVar14 = uVar14 ^ (uint)(byte)__s[lVar12 + 5] << 8;
      case 5:
        uVar28 = uVar28 ^ (((byte)__s[lVar12 + 4] ^ uVar14) * -0x54f16877 >> 0x10 |
                          ((byte)__s[lVar12 + 4] ^ uVar14) * -0x68770000) * 0x38b34ae5;
      case 4:
        uVar14 = (uint)(byte)__s[lVar12 + 3] << 0x18;
      case 3:
        uVar16 = uVar14 | (uint)(byte)__s[lVar12 + 2] << 0x10;
      case 2:
        uVar16 = uVar16 ^ (uint)(byte)__s[lVar12 + 1] << 8;
      case 1:
        uVar23 = uVar23 ^ (((byte)__s[lVar12] ^ uVar16) * 0x239b961b >> 0x11 |
                          ((byte)__s[lVar12] ^ uVar16) * -0x34f28000) * -0x54f16877;
      case 0:
        uVar23 = (uVar23 ^ uVar8) + (uVar29 ^ uVar8) + (uVar28 ^ uVar8) + (uVar22 ^ uVar8);
        uVar28 = (uVar28 ^ uVar8) + uVar23;
        uVar14 = (uVar29 ^ uVar8) + uVar23;
        uVar8 = (uVar22 ^ uVar8) + uVar23;
        uVar22 = (uVar23 >> 0x10 ^ uVar23) * -0x7a143595;
        uVar29 = (uVar22 >> 0xd ^ uVar22) * -0x3d4d51cb;
        uVar22 = (uVar28 >> 0x10 ^ uVar28) * -0x7a143595;
        uVar22 = (uVar22 >> 0xd ^ uVar22) * -0x3d4d51cb;
        uVar22 = uVar22 >> 0x10 ^ uVar22;
        uVar14 = (uVar14 >> 0x10 ^ uVar14) * -0x7a143595;
        uVar14 = (uVar14 >> 0xd ^ uVar14) * -0x3d4d51cb;
        uVar14 = uVar14 >> 0x10 ^ uVar14;
        uVar8 = (uVar8 >> 0x10 ^ uVar8) * -0x7a143595;
        uVar8 = (uVar8 >> 0xd ^ uVar8) * -0x3d4d51cb;
        uVar8 = uVar8 >> 0x10 ^ uVar8;
        iVar15 = (uVar29 >> 0x10 ^ uVar29) + uVar22 + uVar14 + uVar8;
        puVar11 = local_3c;
        local_48 = (char *)CONCAT44(uVar22 + iVar15,iVar15);
        local_40 = uVar14 + iVar15;
        local_3c[0] = uVar8 + iVar15;
        pcVar26 = __s + face->var_postscript_prefix_len;
        pcVar10 = pcVar26 + 0x20;
        *pcVar26 = '-';
        pcVar26[0x21] = '.';
        pcVar26[0x22] = '.';
        pcVar26[0x23] = '.';
        pcVar26[0x24] = '\0';
        iVar15 = 0;
        do {
          uVar8 = *puVar11;
          iVar17 = 8;
          do {
            *pcVar10 = "0123456789ABCDEF"[uVar8 & 0xf];
            pcVar10 = pcVar10 + -1;
            uVar8 = uVar8 >> 4;
            iVar17 = iVar17 + -1;
          } while (iVar17 != 0);
          iVar15 = iVar15 + 1;
          puVar11 = puVar11 + -1;
        } while (iVar15 != 4);
      }
    }
  }
LAB_00164a9c:
  face->postscript_name = __s;
  return __s;
}

Assistant:

static const char*
  sfnt_get_ps_name( TT_Face  face )
  {
    FT_Int       found, win, apple;
    const char*  result = NULL;


    if ( face->postscript_name )
      return face->postscript_name;

#ifdef TT_CONFIG_OPTION_GX_VAR_SUPPORT
    if ( face->blend                                 &&
         ( FT_IS_NAMED_INSTANCE( FT_FACE( face ) ) ||
           FT_IS_VARIATION( FT_FACE( face ) )      ) )
    {
      face->postscript_name = sfnt_get_var_ps_name( face );
      return face->postscript_name;
    }
#endif

    /* scan the name table to see whether we have a Postscript name here, */
    /* either in Macintosh or Windows platform encodings                  */
    found = sfnt_get_name_id( face, TT_NAME_ID_PS_NAME, &win, &apple );
    if ( !found )
      return NULL;

    /* prefer Windows entries over Apple */
    if ( win != -1 )
      result = get_win_string( face->root.memory,
                               face->name_table.stream,
                               face->name_table.names + win,
                               sfnt_is_postscript,
                               1 );
    else
      result = get_apple_string( face->root.memory,
                                 face->name_table.stream,
                                 face->name_table.names + apple,
                                 sfnt_is_postscript,
                                 1 );

    face->postscript_name = result;

    return result;
  }